

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVE.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeNVE::FluctuatingChargeNVE(FluctuatingChargeNVE *this,SimInfo *info)

{
  SnapshotManager *this_00;
  Snapshot *pSVar1;
  SimInfo *in_RSI;
  SimInfo *in_RDI;
  FluctuatingChargePropagator *in_stack_ffffffffffffffd0;
  int *piVar2;
  
  FluctuatingChargePropagator::FluctuatingChargePropagator(in_stack_ffffffffffffffd0,in_RDI);
  in_RDI->_vptr_SimInfo = (_func_int **)&PTR__FluctuatingChargeNVE_00502e00;
  piVar2 = &in_RDI->nIntegrableObjects_;
  this_00 = SimInfo::getSnapshotManager(in_RSI);
  pSVar1 = SnapshotManager::getCurrentSnapshot(this_00);
  *(Snapshot **)piVar2 = pSVar1;
  Thermo::Thermo((Thermo *)&in_RDI->nConstraints_,in_RSI);
  return;
}

Assistant:

FluctuatingChargeNVE::FluctuatingChargeNVE(SimInfo* info) :
      FluctuatingChargePropagator(info),
      snap(info->getSnapshotManager()->getCurrentSnapshot()), thermo(info) {}